

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O3

DatatypeValidator *
xercesc_4_0::DatatypeValidatorFactory::getBuiltInBaseValidator(DatatypeValidator *dv)

{
  XMLCh *key1;
  bool bVar1;
  ulong uVar2;
  DatatypeValidator *pDVar3;
  XMLCh *pXVar4;
  XMLCh XVar5;
  long *plVar6;
  StringHasher *this;
  
  if (dv != (DatatypeValidator *)0x0) {
    do {
      key1 = dv->fTypeLocalName;
      if ((key1 == (XMLCh *)0x0) || (uVar2 = (ulong)(ushort)*key1, uVar2 == 0)) {
        uVar2 = 0;
      }
      else {
        XVar5 = key1[1];
        if (XVar5 != L'\0') {
          pXVar4 = key1 + 2;
          do {
            uVar2 = (ulong)(ushort)XVar5 + (uVar2 >> 0x18) + uVar2 * 0x26;
            XVar5 = *pXVar4;
            pXVar4 = pXVar4 + 1;
          } while (XVar5 != L'\0');
        }
        uVar2 = uVar2 % *(ulong *)(fBuiltInRegistry + 0x18);
      }
      plVar6 = *(long **)(*(long *)(fBuiltInRegistry + 0x10) + uVar2 * 8);
      if (plVar6 != (long *)0x0) {
        this = (StringHasher *)(fBuiltInRegistry + 0x30);
        do {
          bVar1 = StringHasher::equals(this,key1,(void *)plVar6[2]);
          if (bVar1) {
            pDVar3 = (DatatypeValidator *)*plVar6;
            goto LAB_002f5786;
          }
          plVar6 = (long *)plVar6[1];
        } while (plVar6 != (long *)0x0);
      }
      pDVar3 = (DatatypeValidator *)0x0;
LAB_002f5786:
      if (dv == pDVar3) {
        return dv;
      }
      dv = dv->fBaseValidator;
    } while (dv != (DatatypeValidator *)0x0);
  }
  return (DatatypeValidator *)0x0;
}

Assistant:

DatatypeValidator* DatatypeValidatorFactory::getBuiltInBaseValidator(const DatatypeValidator* const dv)
{
    DatatypeValidator *curdv = (DatatypeValidator*)dv;

    while (curdv)
    {
        if (curdv == getBuiltInRegistry()->get(curdv->getTypeLocalName()))
            return curdv;
        else
            curdv = curdv->getBaseValidator();
     }

     return 0;
}